

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Scatter_flat(int g_a,void *v,int *subsArray,int n)

{
  char *str;
  void *__ptr;
  int in_ECX;
  long in_RDX;
  Integer *_subs_array;
  Integer ndim;
  Integer nv;
  Integer a;
  int i;
  int idx;
  Integer in_stack_000001b0;
  Integer in_stack_000001d0;
  Integer in_stack_000001d8;
  void *in_stack_000001e0;
  void *in_stack_000001e8;
  Integer in_stack_000001f0;
  int local_24;
  int local_20;
  
  str = (char *)pnga_ndim(in_stack_000001b0);
  __ptr = malloc((long)((int)str * in_ECX) << 3);
  if (__ptr == (void *)0x0) {
    GA_Error(str,0);
  }
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    for (local_24 = 0; (long)local_24 < (long)str; local_24 = local_24 + 1) {
      *(long *)((long)__ptr + (long)(str + (long)local_20 * (long)str + (-1 - (long)local_24)) * 8)
           = (long)(*(int *)(in_RDX + ((long)local_20 * (long)str + (long)local_24) * 4) + 1);
    }
  }
  pnga_scatter(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
               in_stack_000001d0);
  free(__ptr);
  return;
}

Assistant:

void NGA_Scatter_flat(int g_a, void *v, int subsArray[], int n)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_scatter(a, v, _subs_array, 0, nv);
    
    free(_subs_array);
}